

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O3

string * __thiscall
dtc::text_input_buffer::parse_node_or_property_name_abi_cxx11_
          (string *__return_storage_ptr__,text_input_buffer *this,bool *is_property)

{
  element_type *peVar1;
  bool bVar2;
  _Elt_pointer psVar3;
  _Elt_pointer psVar4;
  int iVar5;
  _Elt_pointer psVar6;
  char cVar7;
  char c;
  vector<char,_std::allocator<char>_> bytes;
  char local_59;
  void *local_58;
  iterator iStack_50;
  char *local_48;
  string *local_38;
  
  if (*is_property == true) {
    parse_property_name_abi_cxx11_(__return_storage_ptr__,this);
  }
  else {
    local_58 = (void *)0x0;
    iStack_50._M_current = (char *)0x0;
    local_48 = (char *)0x0;
    psVar6 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar4 = (this->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar4 == psVar6) {
      cVar7 = '\0';
    }
    else {
      psVar3 = psVar4;
      if (psVar4 == (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar3 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = peVar1->cursor;
      cVar7 = '\0';
      if ((-1 < (long)iVar5) && (cVar7 = '\0', iVar5 < peVar1->size)) {
        cVar7 = peVar1->buffer[iVar5];
      }
    }
    local_59 = cVar7;
    local_38 = __return_storage_ptr__;
    bVar2 = anon_unknown_1::is_node_name_character::check(cVar7);
    if (bVar2) {
      do {
        if (iStack_50._M_current == local_48) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_58,iStack_50,&local_59);
        }
        else {
          *iStack_50._M_current = cVar7;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        psVar6 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar4 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar4 == psVar6) {
          cVar7 = '\0';
          psVar6 = psVar4;
        }
        else {
          this->cursor = this->cursor + 1;
          psVar3 = psVar4;
          if (psVar4 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar3 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar5 = peVar1->cursor + 1;
          peVar1->cursor = iVar5;
          if (peVar1->size <= iVar5) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&(this->input_stack).c);
            psVar6 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          if (psVar4 == psVar6) {
            cVar7 = '\0';
          }
          else {
            psVar3 = psVar4;
            if (psVar4 == (this->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar3 = (this->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar5 = peVar1->cursor;
            cVar7 = '\0';
            if ((-1 < (long)iVar5) && (iVar5 < peVar1->size)) {
              cVar7 = peVar1->buffer[iVar5];
            }
          }
        }
        local_59 = cVar7;
        bVar2 = anon_unknown_1::is_node_name_character::check(cVar7);
      } while (bVar2);
    }
    if (psVar4 == psVar6) {
      cVar7 = '\0';
    }
    else {
      if (psVar4 == (this->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        psVar4 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
      }
      peVar1 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = peVar1->cursor;
      cVar7 = '\0';
      if ((-1 < (long)iVar5) && (cVar7 = '\0', iVar5 < peVar1->size)) {
        cVar7 = peVar1->buffer[iVar5];
      }
    }
    local_59 = cVar7;
    bVar2 = anon_unknown_1::is_property_name_character::check(cVar7);
    if (bVar2) {
      do {
        if (iStack_50._M_current == local_48) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&local_58,iStack_50,&local_59);
        }
        else {
          *iStack_50._M_current = cVar7;
          iStack_50._M_current = iStack_50._M_current + 1;
        }
        *is_property = true;
        psVar6 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar4 = (this->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar4 == psVar6) {
LAB_001368d4:
          cVar7 = '\0';
        }
        else {
          this->cursor = this->cursor + 1;
          psVar3 = psVar4;
          if (psVar4 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar3 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar3[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar5 = peVar1->cursor + 1;
          peVar1->cursor = iVar5;
          if (peVar1->size <= iVar5) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&(this->input_stack).c);
            psVar6 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur;
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          }
          if (psVar4 == psVar6) goto LAB_001368d4;
          if (psVar4 == (this->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar4 = (this->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar1 = psVar4[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar5 = peVar1->cursor;
          cVar7 = '\0';
          if ((-1 < (long)iVar5) && (iVar5 < peVar1->size)) {
            cVar7 = peVar1->buffer[iVar5];
          }
        }
        local_59 = cVar7;
        bVar2 = anon_unknown_1::is_property_name_character::check(cVar7);
      } while (bVar2);
    }
    __return_storage_ptr__ = local_38;
    (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)local_38,local_58,iStack_50._M_current);
    if (local_58 != (void *)0x0) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string
text_input_buffer::parse_node_or_property_name(bool &is_property)
{
	if (is_property)
	{
		return parse_property_name();
	}
	std::vector<char> bytes;
	for (char c=*(*this) ; is_node_name_character::check(c) ; c=*(++(*this)))
	{
		bytes.push_back(c);
	}
	for (char c=*(*this) ; is_property_name_character::check(c) ; c=*(++(*this)))
	{
		bytes.push_back(c);
		is_property = true;
	}
	return string(bytes.begin(), bytes.end());
}